

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O2

char * FindFileContentInImportPaths
                 (InplaceStr moduleName,char *moduleRoot,bool addExtension,char *resultPathBuf,
                 uint resultPathBufSize,uint *fileSize)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  char *pcVar4;
  ulong uVar5;
  uint pos;
  bool bVar6;
  
  bVar6 = moduleRoot == (char *)0x0;
  if (bVar6) {
    moduleRoot = "";
  }
  pcVar4 = "/";
  if (bVar6) {
    pcVar4 = "";
  }
  pos = 0;
  do {
    pcVar2 = BinaryCache::EnumImportPath(pos);
    if (pcVar2 == (char *)0x0) {
      return (char *)0x0;
    }
    iVar1 = NULLC::SafeSprintf(resultPathBuf,(ulong)resultPathBufSize,"%s%s%s%.*s",pcVar2,moduleRoot
                               ,pcVar4,(ulong)(uint)((int)moduleName.end - (int)moduleName.begin),
                               moduleName.begin);
    if (addExtension) {
      sVar3 = strlen(pcVar2);
      pcVar2 = resultPathBuf + sVar3;
      sVar3 = strlen(pcVar2);
      for (uVar5 = 0; (sVar3 & 0xffffffff) != uVar5; uVar5 = uVar5 + 1) {
        if (pcVar2[uVar5] == '.') {
          pcVar2[uVar5] = '/';
        }
      }
      NULLC::SafeSprintf(resultPathBuf + iVar1,(ulong)(resultPathBufSize - iVar1),".nc");
    }
    pos = pos + 1;
    pcVar2 = (char *)(*(code *)NULLC::fileLoad)(resultPathBuf,fileSize);
  } while (pcVar2 == (char *)0x0);
  return pcVar2;
}

Assistant:

const char* FindFileContentInImportPaths(InplaceStr moduleName, const char *moduleRoot, bool addExtension, char *resultPathBuf, unsigned resultPathBufSize, unsigned &fileSize)
{
	const char *fileContent = NULL;

	unsigned modulePathPos = 0;
	while(const char *modulePath = BinaryCache::EnumImportPath(modulePathPos++))
	{
		char *pathEnd = resultPathBuf + NULLC::SafeSprintf(resultPathBuf, resultPathBufSize, "%s%s%s%.*s", modulePath, moduleRoot ? moduleRoot : "", moduleRoot ? "/" : "", moduleName.length(), moduleName.begin);

		if(addExtension)
		{
			char *pathNoImport = resultPathBuf + strlen(modulePath);

			for(unsigned i = 0, e = (unsigned)strlen(pathNoImport); i != e; i++)
			{
				if(pathNoImport[i] == '.')
					pathNoImport[i] = '/';
			}

			NULLC::SafeSprintf(pathEnd, resultPathBufSize - int(pathEnd - resultPathBuf), ".nc");
		}

		fileContent = NULLC::fileLoad(resultPathBuf, &fileSize);

		if(fileContent)
			break;
	}

	return fileContent;
}